

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O0

void __thiscall DIS::IFFPdu::marshal(IFFPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_40 [8];
  IFFFundamentalParameterData x;
  size_t idx;
  DataStream *dataStream_local;
  IFFPdu *this_local;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::marshal(&this->_eventID,dataStream);
  Vector3Float::marshal(&this->_relativeAntennaLocation,dataStream);
  SystemIdentifier::marshal(&this->_systemID,dataStream);
  DataStream::operator<<(dataStream,this->_systemDesignator);
  DataStream::operator<<(dataStream,this->_systemSpecificData);
  FundamentalOperationalData::marshal(&this->_fundamentalOperationalData,dataStream);
  LayerHeader::marshal(&this->_layerHeader,dataStream);
  BeamData::marshal(&this->_beamData,dataStream);
  SecondaryOperationalData::marshal(&this->_secondaryOperationalData,dataStream);
  sVar2 = std::
          vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
          ::size(&this->_iffParameters);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  x._burstLength = 0;
  x._applicableModes = '\0';
  x._systemSpecificData[0] = '\0';
  x._systemSpecificData[1] = '\0';
  x._systemSpecificData[2] = '\0';
  while( true ) {
    uVar1 = x._24_8_;
    sVar2 = std::
            vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
            ::size(&this->_iffParameters);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::
             vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
             ::operator[](&this->_iffParameters,x._24_8_);
    IFFFundamentalParameterData::IFFFundamentalParameterData
              ((IFFFundamentalParameterData *)local_40,pvVar3);
    IFFFundamentalParameterData::marshal((IFFFundamentalParameterData *)local_40,dataStream);
    IFFFundamentalParameterData::~IFFFundamentalParameterData
              ((IFFFundamentalParameterData *)local_40);
    x._24_8_ = x._24_8_ + 1;
  }
  return;
}

Assistant:

void IFFPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _emittingEntityID.marshal(dataStream);
    _eventID.marshal(dataStream);
    _relativeAntennaLocation.marshal(dataStream);
    _systemID.marshal(dataStream);
    dataStream << _systemDesignator;
    dataStream << _systemSpecificData;
    _fundamentalOperationalData.marshal(dataStream);
    _layerHeader.marshal(dataStream);
    _beamData.marshal(dataStream);
    _secondaryOperationalData.marshal(dataStream);
    dataStream << ( unsigned char )_iffParameters.size();
    for(size_t idx = 0; idx < _iffParameters.size(); idx++)
    {
        IFFFundamentalParameterData x = _iffParameters[idx];
        x.marshal(dataStream);
    }

}